

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32::anon_class_16_2_3fdfa3b0::operator()
          (anon_class_16_2_3fdfa3b0 *this,SVInt *svi)

{
  SourceRange range;
  bool bVar1;
  int *piVar2;
  _Optional_payload_base<unsigned_int> *in_RDI;
  SourceRange SVar3;
  SyntaxNode *unaff_retaddr;
  optional<int> value;
  uint *in_stack_ffffffffffffffa8;
  _Optional_payload_base<unsigned_int> this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SVInt *in_stack_ffffffffffffffc8;
  _Optional_base<unsigned_int,_true,_true> local_8;
  
  this_00 = *in_RDI;
  SVInt::as<int>(in_stack_ffffffffffffffc8);
  bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x38d0f9);
  if ((bVar1) && (piVar2 = std::optional<int>::operator*((optional<int> *)0x38d109), -1 < *piVar2))
  {
    std::optional<int>::operator*((optional<int> *)0x38d15e);
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)in_RDI,in_stack_ffffffffffffffa8);
  }
  else {
    SVar3 = slang::syntax::SyntaxNode::sourceRange(unaff_retaddr);
    range.startLoc._4_4_ = in_stack_ffffffffffffffc4;
    range.startLoc._0_4_ = in_stack_ffffffffffffffc0;
    range.endLoc = SVar3.startLoc;
    addDiag((Preprocessor *)this_00,SVar3.endLoc._4_4_,range);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x38d152);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         local_8._M_payload.super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}